

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  char *pcVar4;
  Nonnull<const_char_*> failure_msg;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  LogMessageFatal local_40;
  
  uVar7 = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)uVar7,this->unknown_);
  }
  iVar8 = ctx->depth_;
  iVar6 = iVar8 + -1;
  ctx->depth_ = iVar6;
  if (iVar8 < 1) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar8 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar8;
    pcVar4 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar4 != (char *)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar6,ctx->depth_,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x491;
LAB_00217b94:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar6,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar8,ctx->group_depth_,"old_group_depth == group_depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x492;
        goto LAB_00217b94;
      }
    }
    uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    pcVar5 = (char *)0x0;
    if (((pcVar4 != (char *)0x0) && (uVar3 == uVar7)) &&
       (pcVar5 = pcVar4, this->unknown_ != (string *)0x0)) {
      WriteVarint((ulong)(num << 3 | 4),this->unknown_);
    }
  }
  return pcVar5;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }